

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

Device * Fossilize::get_device_layer(VkDevice device)

{
  Device *pDVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> holder;
  void *key;
  Device *layer;
  VkDevice device_local;
  
  holder._M_device = (mutex_type *)getDispatchKey(device);
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)globalLock);
  pDVar1 = getLayerData<Fossilize::Device>
                     (holder._M_device,
                      (unordered_map<void_*,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>_>
                       *)deviceData);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return pDVar1;
}

Assistant:

static Device *get_device_layer(VkDevice device)
{
	// Need to hold a lock while querying the global hashmap, but not after it.
	Device *layer = nullptr;
	void *key = getDispatchKey(device);
	lock_guard<mutex> holder{ globalLock };
	layer = getLayerData(key, deviceData);
	return layer;
}